

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_bddClosestCube(DdManager *dd,DdNode *f,DdNode *g,int *distance)

{
  double local_48;
  double rdist;
  DdNode *acube;
  DdNode *res;
  int *distance_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  res = (DdNode *)distance;
  distance_local = (int *)g;
  g_local = f;
  f_local = &dd->sentinel;
  do {
    *(undefined4 *)&f_local[0xb].next = 0;
    acube = cuddBddClosestCube((DdManager *)f_local,g_local,(DdNode *)distance_local,2147483648.0);
  } while (*(int *)&f_local[0xb].next == 1);
  if (acube == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) + 1;
    do {
      *(undefined4 *)&f_local[0xb].next = 0;
      rdist = (double)separateCube((DdManager *)f_local,acube,&local_48);
    } while (*(int *)&f_local[0xb].next == 1);
    if ((DdNode *)rdist == (DdNode *)0x0) {
      Cudd_RecursiveDeref((DdManager *)f_local,acube);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)rdist & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)rdist & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)f_local,acube);
      do {
        *(undefined4 *)&f_local[0xb].next = 0;
        acube = cuddAddBddDoPattern((DdManager *)f_local,(DdNode *)rdist);
      } while (*(int *)&f_local[0xb].next == 1);
      if (acube == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)rdist);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)rdist);
        res->index = (int)local_48;
        *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)acube & 0xfffffffffffffffe) + 4) + -1;
        dd_local = (DdManager *)acube;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddClosestCube(
  DdManager *dd,
  DdNode * f,
  DdNode *g,
  int *distance)
{
    DdNode *res, *acube;
    CUDD_VALUE_TYPE rdist;

    /* Compute the cube and distance as a single ADD. */
    do {
        dd->reordered = 0;
        res = cuddBddClosestCube(dd,f,g,CUDD_CONST_INDEX + 1.0);
    } while (dd->reordered == 1);
    if (res == NULL) return(NULL);
    cuddRef(res);

    /* Unpack distance and cube. */
    do {
        dd->reordered = 0;
        acube = separateCube(dd, res, &rdist);
    } while (dd->reordered == 1);
    if (acube == NULL) {
        Cudd_RecursiveDeref(dd, res);
        return(NULL);
    }
    cuddRef(acube);
    Cudd_RecursiveDeref(dd, res);

    /* Convert cube from ADD to BDD. */
    do {
        dd->reordered = 0;
        res = cuddAddBddDoPattern(dd, acube);
    } while (dd->reordered == 1);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, acube);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, acube);

    *distance = (int) rdist;
    cuddDeref(res);
    return(res);

}